

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::TextTreeRenderer::SplitUpExtraInfo
          (TextTreeRenderer *this,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *extra_info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result,idx_t max_lines)

{
  pointer pcVar1;
  idx_t iVar2;
  size_type sVar3;
  pointer ppVar4;
  pointer pbVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long *plVar12;
  string *extraout_RAX;
  string *psVar13;
  reference pvVar14;
  const_iterator cVar15;
  undefined8 extraout_RAX_00;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *split;
  size_type __n;
  ulong __n_00;
  pointer ppVar17;
  undefined8 uVar18;
  TextTreeRenderer *pTVar19;
  pointer ppVar20;
  bool bVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  string str;
  undefined1 local_148 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  TextTreeRenderer *local_f8;
  string local_f0;
  idx_t local_d0;
  string *local_c8;
  string *psStack_c0;
  pointer local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b0;
  ulong local_a8;
  ulong local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((extra_info->map_idx)._M_h._M_element_count != 0) {
    ppVar20 = (extra_info->map).
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar17 = (extra_info->map).
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar21 = ppVar20 == ppVar17;
    local_118.field_2._M_allocated_capacity = (size_type)extra_info;
    local_f8 = this;
    local_d0 = max_lines;
    if (!bVar21) {
      bVar9 = Utf8Proc::IsValid((ppVar20->second)._M_dataplus._M_p,
                                (ppVar20->second)._M_string_length);
      if (bVar9) {
        do {
          bVar21 = ppVar20 + 1 == ppVar17;
          if (bVar21) goto LAB_00ad94eb;
          bVar9 = Utf8Proc::IsValid(ppVar20[1].second._M_dataplus._M_p,
                                    ppVar20[1].second._M_string_length);
          ppVar20 = ppVar20 + 1;
        } while (bVar9);
      }
      if (!bVar21) {
        return;
      }
    }
LAB_00ad94eb:
    ExtraInfoSeparator_abi_cxx11_(&local_f0,local_f8);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_f0
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    ppVar20 = *(pointer *)local_118.field_2._M_allocated_capacity;
    local_98 = *(pointer *)(local_118.field_2._M_allocated_capacity + 8);
    if (ppVar20 != local_98) {
      local_a0 = local_d0 >> 1;
      local_b0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_118.field_2._M_allocated_capacity + 0x18);
      local_118.field_2._12_4_ = 0;
      local_a8 = 0;
      do {
        pTVar19 = (TextTreeRenderer *)(ppVar20->second)._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pTVar19,
                   (pointer)((long)&(pTVar19->super_TreeRenderer)._vptr_TreeRenderer +
                            (ppVar20->second)._M_string_length));
        RemovePadding(&local_f0,pTVar19,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar11 = 5;
        if (local_f0._M_string_length != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar1 = (ppVar20->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar1,pcVar1 + (ppVar20->first)._M_string_length);
          pTVar19 = local_f8;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"__","");
          bVar21 = StringUtil::StartsWith(&local_90,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          sVar8 = local_f0._M_string_length;
          if (bVar21) {
LAB_00ad981a:
            uVar10 = 0;
          }
          else {
            iVar2 = (pTVar19->config).node_render_width;
            sVar3 = (ppVar20->first)._M_string_length;
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,anon_var_dwarf_6435278 + 8,anon_var_dwarf_6435278 + 9);
            bVar21 = StringUtil::Contains(&local_f0,(string *)local_148);
            if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
              operator_delete((void *)local_148._0_8_);
            }
            if (bVar21 || iVar2 - 7 <= sVar3 + sVar8 + 2) {
              local_128._M_allocated_capacity = (size_type)&local_118;
              pcVar1 = (ppVar20->first)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,pcVar1,pcVar1 + (ppVar20->first)._M_string_length);
              ::std::__cxx11::string::append(local_128._M_local_buf);
              pTVar19 = local_f8;
              plVar12 = (long *)::std::__cxx11::string::_M_append
                                          (local_128._M_local_buf,(ulong)local_f0._M_dataplus._M_p);
              psVar13 = (string *)(plVar12 + 2);
              if ((string *)*plVar12 == psVar13) {
                local_148._16_8_ = (psVar13->_M_dataplus)._M_p;
                local_148._24_8_ = plVar12[3];
                local_148._0_8_ = (string *)(local_148 + 0x10);
              }
              else {
                local_148._16_8_ = (psVar13->_M_dataplus)._M_p;
                local_148._0_8_ = (string *)*plVar12;
              }
              local_148._8_8_ = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_f0,(string *)local_148);
              if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_);
              }
              if ((string *)local_128._M_allocated_capacity != &local_118) {
                operator_delete((void *)local_128._M_allocated_capacity);
              }
              goto LAB_00ad981a;
            }
            local_128._M_allocated_capacity = (size_type)&local_118;
            pcVar1 = (ppVar20->first)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar1,pcVar1 + (ppVar20->first)._M_string_length);
            ::std::__cxx11::string::append(local_128._M_local_buf);
            pTVar19 = local_f8;
            plVar12 = (long *)::std::__cxx11::string::_M_append
                                        (local_128._M_local_buf,(ulong)local_f0._M_dataplus._M_p);
            psVar13 = (string *)(plVar12 + 2);
            if ((string *)*plVar12 == psVar13) {
              local_148._16_8_ = (psVar13->_M_dataplus)._M_p;
              local_148._24_8_ = plVar12[3];
              local_148._0_8_ = (string *)(local_148 + 0x10);
            }
            else {
              local_148._16_8_ = (psVar13->_M_dataplus)._M_p;
              local_148._0_8_ = (string *)*plVar12;
            }
            local_148._8_8_ = plVar12[1];
            *plVar12 = (long)psVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)&local_f0,(string *)local_148);
            if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            psVar13 = &local_118;
            if ((string *)local_128._M_allocated_capacity != psVar13) {
              operator_delete((void *)local_128._M_allocated_capacity);
              psVar13 = extraout_RAX;
            }
            uVar10 = (uint)CONCAT71((int7)((ulong)psVar13 >> 8),1);
          }
          local_118.field_2._12_4_ = local_118.field_2._12_4_ & 0xff;
          if (((byte)local_a8 & (byte)uVar10) != 0) {
            local_118.field_2._12_4_ = 0;
          }
          if ((local_118.field_2._12_4_ & 1) != 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)result);
          }
          iVar11 = ::std::__cxx11::string::compare((char *)ppVar20);
          if (iVar11 == 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)result);
            local_148._0_8_ = local_148 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"__timing__","");
            cVar15 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_b0,(key_type *)local_148);
            if (cVar15.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ppVar17 = *(pointer *)(local_118.field_2._M_allocated_capacity + 8);
            }
            else {
              ppVar17 = (pointer)(*(long *)((long)cVar15.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) * 0x40 +
                                 *(long *)local_118.field_2._M_allocated_capacity);
            }
            ppVar4 = *(pointer *)(local_118.field_2._M_allocated_capacity + 8);
            if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            if (ppVar17 == ppVar4) {
              iVar11 = 4;
            }
            else {
LAB_00ad9bcd:
              iVar11 = 4;
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)result);
            }
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)ppVar20);
            if (iVar11 == 0) {
              local_148._0_8_ = local_148 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_148,"__cardinality__","");
              cVar15 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(local_b0,(key_type *)local_148);
              if (cVar15.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                ppVar17 = *(pointer *)(local_118.field_2._M_allocated_capacity + 8);
              }
              else {
                ppVar17 = (pointer)(*(long *)((long)cVar15.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) * 0x40 +
                                   *(long *)local_118.field_2._M_allocated_capacity);
              }
              ppVar4 = *(pointer *)(local_118.field_2._M_allocated_capacity + 8);
              if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_);
              }
              if (ppVar17 == ppVar4) goto LAB_00ad9bcd;
              pbVar5 = (result->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              (result->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar5 + -1;
              pcVar1 = pbVar5[-1]._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1 != &pbVar5[-1].field_2) {
                operator_delete(pcVar1);
              }
              iVar11 = 5;
            }
            else {
              local_148._0_8_ = local_148 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_148,anon_var_dwarf_6435278 + 8,anon_var_dwarf_6435278 + 9);
              StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)&local_128,&local_f0,(string *)local_148);
              if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_);
              }
              uVar18 = local_128._M_allocated_capacity;
              uVar6 = local_128._8_8_;
              if (local_d0 < (ulong)((long)(local_128._8_8_ - local_128._0_8_) >> 5)) {
                local_c8 = (string *)0x0;
                psStack_c0 = (string *)0x0;
                local_b8 = (pointer)0x0;
                if (1 < local_d0) {
                  __n = 0;
                  do {
                    pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                            *)&local_128,__n);
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_c8,pvVar14);
                    __n = __n + 1;
                  } while (local_a0 != __n);
                }
                local_148._0_8_ = local_148 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"...","");
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
                if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                  operator_delete((void *)local_148._0_8_);
                }
                uVar16 = (long)(local_128._8_8_ - local_128._0_8_) >> 5;
                for (__n_00 = uVar16 - local_a0; _Var7._M_p = local_118._M_dataplus._M_p,
                    uVar18 = local_128._8_8_, uVar6 = local_128._M_allocated_capacity,
                    __n_00 < uVar16; __n_00 = __n_00 + 1) {
                  pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                          *)&local_128,__n_00);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_c8,pvVar14);
                  uVar16 = (long)(local_128._8_8_ - local_128._0_8_) >> 5;
                }
                local_128._M_allocated_capacity = (size_type)local_c8;
                local_128._8_8_ = psStack_c0;
                local_118._M_dataplus._M_p = local_b8;
                local_148._16_8_ = _Var7._M_p;
                local_148._0_8_ = uVar6;
                local_148._8_8_ = uVar18;
                local_c8 = (string *)0x0;
                psStack_c0 = (string *)0x0;
                local_b8 = (pointer)0x0;
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_c8);
                uVar18 = local_128._M_allocated_capacity;
                uVar6 = local_128._8_8_;
              }
              for (; uVar18 != uVar6; uVar18 = (string *)(uVar18 + 0x20)) {
                SplitStringBuffer(pTVar19,(string *)uVar18,result);
              }
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128._M_local_buf);
              iVar11 = 0;
              local_118.field_2._12_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1)
              ;
              local_a8 = (ulong)uVar10;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      } while (((iVar11 == 5) || (iVar11 == 0)) && (ppVar20 = ppVar20 + 1, ppVar20 != local_98));
    }
  }
  return;
}

Assistant:

void TextTreeRenderer::SplitUpExtraInfo(const InsertionOrderPreservingMap<string> &extra_info, vector<string> &result,
                                        idx_t max_lines) {
	if (extra_info.empty()) {
		return;
	}
	for (auto &item : extra_info) {
		auto &text = item.second;
		if (!Utf8Proc::IsValid(text.c_str(), text.size())) {
			return;
		}
	}
	result.push_back(ExtraInfoSeparator());

	bool requires_padding = false;
	bool was_inlined = false;
	for (auto &item : extra_info) {
		string str = RemovePadding(item.second);
		if (str.empty()) {
			continue;
		}
		bool is_inlined = false;
		if (!StringUtil::StartsWith(item.first, "__")) {
			// the name is not internal (i.e. not __text__) - so we display the name in addition to the entry
			const idx_t available_width = (config.node_render_width - 7);
			idx_t total_size = item.first.size() + str.size() + 2;
			bool is_multiline = StringUtil::Contains(str, "\n");
			if (!is_multiline && total_size < available_width) {
				// we can inline the full entry - no need for any separators unless the previous entry explicitly
				// requires it
				str = item.first + ": " + str;
				is_inlined = true;
			} else {
				str = item.first + ":\n" + str;
			}
		}
		if (is_inlined && was_inlined) {
			// we can skip the padding if we have multiple inlined entries in a row
			requires_padding = false;
		}
		if (requires_padding) {
			result.emplace_back();
		}
		// cardinality, timing and estimated cardinality are rendered separately
		// this is to allow alignment horizontally across nodes
		if (item.first == RenderTreeNode::CARDINALITY) {
			// cardinality - need to reserve space for cardinality AND timing
			result.emplace_back();
			if (extra_info.find(RenderTreeNode::TIMING) != extra_info.end()) {
				result.emplace_back();
			}
			break;
		}
		if (item.first == RenderTreeNode::ESTIMATED_CARDINALITY) {
			// estimated cardinality - reserve space for estimate
			if (extra_info.find(RenderTreeNode::CARDINALITY) != extra_info.end()) {
				// if we have a true cardinality render that instead of the estimate
				result.pop_back();
				continue;
			}
			result.emplace_back();
			break;
		}
		auto splits = StringUtil::Split(str, "\n");
		if (splits.size() > max_lines) {
			// truncate this entry
			vector<string> truncated_splits;
			for (idx_t i = 0; i < max_lines / 2; i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			truncated_splits.push_back("...");
			for (idx_t i = splits.size() - max_lines / 2; i < splits.size(); i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			splits = std::move(truncated_splits);
		}
		for (auto &split : splits) {
			SplitStringBuffer(split, result);
		}
		requires_padding = true;
		was_inlined = is_inlined;
	}
}